

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O0

void Curl_hexencode(uchar *src,size_t len,uchar *out,size_t olen)

{
  char *pcVar1;
  char *hex;
  size_t olen_local;
  uchar *out_local;
  size_t len_local;
  uchar *src_local;
  
  if (((src == (uchar *)0x0) || (len == 0)) ||
     (hex = (char *)olen, olen_local = (size_t)out, out_local = (uchar *)len,
     len_local = (size_t)src, olen < 3)) {
    if (olen != 0) {
      *out = '\0';
    }
  }
  else {
    for (; out_local != (uchar *)0x0 && (char *)0x2 < hex; hex = hex + -2) {
      pcVar1 = (char *)(olen_local + 1);
      *(char *)olen_local = "0123456789abcdef"[(int)(*(byte *)len_local & 0xf0) >> 4];
      olen_local = olen_local + 2;
      *pcVar1 = "0123456789abcdef"[(int)(*(byte *)len_local & 0xf)];
      len_local = len_local + 1;
      out_local = out_local + -1;
    }
    *(undefined1 *)olen_local = 0;
  }
  return;
}

Assistant:

void Curl_hexencode(const unsigned char *src, size_t len, /* input length */
                    unsigned char *out, size_t olen) /* output buffer size */
{
  const char *hex = "0123456789abcdef";
  DEBUGASSERT(src && len && (olen >= 3));
  if(src && len && (olen >= 3)) {
    while(len-- && (olen >= 3)) {
      /* clang-tidy warns on this line without this comment: */
      /* NOLINTNEXTLINE(clang-analyzer-core.UndefinedBinaryOperatorResult) */
      *out++ = hex[(*src & 0xF0)>>4];
      *out++ = hex[*src & 0x0F];
      ++src;
      olen -= 2;
    }
    *out = 0;
  }
  else if(olen)
    *out = 0;
}